

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O2

void __thiscall
qclab::qgates::iSWAP<std::complex<float>_>::apply
          (iSWAP<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  uint __line;
  char *__assertion;
  int target;
  int qubit;
  CNOT<std::complex<float>_> CNOT;
  Phase90<std::complex<float>_> S;
  Hadamard<std::complex<float>_> H;
  int qnew [2];
  
  if (nbQubits < 2) {
    __assertion = "nbQubits >= 2";
    __line = 0x25;
  }
  else if (matrix->size_ == (long)(1 << ((byte)nbQubits & 0x1f))) {
    qubit = (this->qubits_)._M_elems[0] + offset;
    if (qubit < nbQubits) {
      target = offset + (this->qubits_)._M_elems[1];
      if (target < nbQubits) {
        Phase90<std::complex<float>_>::Phase90(&S,qubit);
        Hadamard<std::complex<float>_>::Hadamard(&H,qubit);
        CX<std::complex<float>_>::CX(&CNOT,qubit,target,1);
        Phase90<std::complex<float>_>::apply(&S,side,op,nbQubits,matrix,0);
        QGate1<std::complex<float>_>::setQubit(&S.super_QGate1<std::complex<float>_>,target);
        Phase90<std::complex<float>_>::apply(&S,side,op,nbQubits,matrix,0);
        Hadamard<std::complex<float>_>::apply(&H,side,op,nbQubits,matrix,0);
        CX<std::complex<float>_>::apply(&CNOT,side,op,nbQubits,matrix,0);
        qnew[0] = target;
        qnew[1] = qubit;
        QControlledGate2<std::complex<float>_>::setQubits
                  (&CNOT.super_QControlledGate2<std::complex<float>_>,qnew);
        CX<std::complex<float>_>::apply(&CNOT,side,op,nbQubits,matrix,0);
        QGate1<std::complex<float>_>::setQubit(&H.super_QGate1<std::complex<float>_>,target);
        Hadamard<std::complex<float>_>::apply
                  ((Hadamard<std::complex<float>_> *)&H.super_QGate1<std::complex<float>_>,side,op,
                   nbQubits,matrix,0);
        CX<std::complex<float>_>::~CX(&CNOT);
        return;
      }
      __assertion = "qubit1 < nbQubits";
    }
    else {
      __assertion = "qubit0 < nbQubits";
    }
    __line = 0x29;
  }
  else {
    __assertion = "matrix.size() == 1 << nbQubits";
    __line = 0x26;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/iSWAP.cpp"
                ,__line,
                "virtual void qclab::qgates::iSWAP<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
               );
}

Assistant:

void iSWAP< T >::apply( Side side , Op op , const int nbQubits ,
                          qclab::dense::SquareMatrix< T >& matrix ,
                          const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit0 = qubits_[0] + offset ;
    const int qubit1 = qubits_[1] + offset ;
    assert( qubit0 < nbQubits ) ; assert( qubit1 < nbQubits ) ;
    //
    // -/-----\-   -[S]-[H]--*--[X]-----   -----[X]--*--[H]-[S]-
    //  |iSWAP|  =           |   |       =       |   |
    // -\-----/-   -[S]-----[X]--*--[H]-   -[H]--*--[X]-----[S]-
    //
    qclab::qgates::Phase90< T >  S( qubit0 ) ;
    qclab::qgates::Hadamard< T > H( qubit0 ) ;
    qclab::qgates::CNOT< T >     CNOT( qubit0 , qubit1 ) ;
    // layer 1
    S.apply( side , op , nbQubits , matrix ) ;
    S.setQubit( qubit1 ) ;
    S.apply( side , op , nbQubits , matrix ) ;
    // layer 2
    H.apply( side , op , nbQubits , matrix ) ;
    // layer 3
    CNOT.apply( side , op , nbQubits , matrix ) ;
    // layer 4
    int qnew[] = { qubit1 , qubit0 } ;
    CNOT.setQubits( &qnew[0] ) ;
    CNOT.apply( side , op , nbQubits , matrix ) ;
    // layer 5
    H.setQubit( qubit1 ) ;
    H.apply( side , op , nbQubits , matrix ) ;
  }